

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O2

void __thiscall Opcode::AABBTreeCollider::_CollideBoxTri(AABBTreeCollider *this,AABBNoLeafNode *b)

{
  Point *v0;
  Point *v1;
  Point *v2;
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  udword uVar6;
  AABBNoLeafNode *b_00;
  MeshInterface *pMVar7;
  IndexedTriangle *pIVar8;
  udword q;
  BOOL BVar9;
  long lVar10;
  ulong uVar11;
  Point *pPVar12;
  udword *puVar13;
  ulong uVar14;
  Point *pPVar15;
  ulong uVar16;
  Point *pPVar17;
  Point *u1;
  udword uVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  Point local_1a4;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  uint uStack_180;
  uint uStack_17c;
  Container *local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [8];
  uint uStack_120;
  uint uStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  Point vmax;
  float local_94;
  undefined8 local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  v0 = this->mLeafVerts;
  v1 = this->mLeafVerts + 1;
  v2 = this->mLeafVerts + 2;
  local_170 = &this->mPairs;
  do {
    this->mNbBVPrimTests = this->mNbBVPrimTests + 1;
    fVar38 = this->mLeafVerts[0].x;
    fVar29 = this->mLeafVerts[1].x;
    fVar24 = (b->mAABB).mCenter.x;
    fVar25 = (b->mAABB).mExtents.x;
    _local_128 = ZEXT416((uint)fVar38);
    fVar34 = fVar38 - fVar24;
    fVar32 = this->mLeafVerts[2].x;
    local_58 = ZEXT416((uint)fVar29);
    _local_138 = ZEXT416((uint)fVar32);
    local_158._0_4_ = fVar29 - fVar24;
    local_158._4_4_ = fVar32 - fVar24;
    if ((float)local_158._0_4_ <= fVar34) {
      fVar33 = fVar34;
      fVar26 = (float)local_158._0_4_;
      if ((float)local_158._4_4_ <= (float)local_158._0_4_) {
        fVar26 = (float)local_158._4_4_;
      }
    }
    else {
      fVar33 = (float)local_158._0_4_;
      fVar26 = fVar34;
      if ((float)local_158._4_4_ <= fVar34) {
        fVar26 = (float)local_158._4_4_;
      }
    }
    if (fVar25 < fVar26) {
      return;
    }
    fVar26 = (float)local_158._4_4_;
    if ((float)local_158._4_4_ <= fVar33) {
      fVar26 = fVar33;
    }
    if (fVar26 < -fVar25) {
      return;
    }
    fVar33 = this->mLeafVerts[0].y;
    fVar26 = this->mLeafVerts[1].y;
    fVar37 = (b->mAABB).mCenter.y;
    fVar41 = (b->mAABB).mExtents.y;
    fVar36 = fVar33 - fVar37;
    fVar21 = this->mLeafVerts[2].y;
    local_78 = ZEXT416((uint)fVar26);
    local_148._0_4_ = fVar26 - fVar37;
    local_148._4_4_ = fVar21 - fVar37;
    if ((float)local_148._0_4_ <= fVar36) {
      fVar22 = fVar36;
      fVar23 = (float)local_148._0_4_;
      if ((float)local_148._4_4_ <= (float)local_148._0_4_) {
        fVar23 = (float)local_148._4_4_;
      }
    }
    else {
      fVar22 = (float)local_148._0_4_;
      fVar23 = fVar36;
      if ((float)local_148._4_4_ <= fVar36) {
        fVar23 = (float)local_148._4_4_;
      }
    }
    if (fVar41 < fVar23) {
      return;
    }
    fVar23 = (float)local_148._4_4_;
    if ((float)local_148._4_4_ <= fVar22) {
      fVar23 = fVar22;
    }
    if (fVar23 < -fVar41) {
      return;
    }
    fVar22 = this->mLeafVerts[0].z;
    fVar23 = this->mLeafVerts[1].z;
    fVar27 = (b->mAABB).mCenter.z;
    fVar28 = (b->mAABB).mExtents.z;
    local_f8 = ZEXT416((uint)fVar28);
    local_88 = ZEXT416((uint)fVar23);
    fVar43 = fVar23 - fVar27;
    local_68 = ZEXT416((uint)fVar43);
    fVar35 = this->mLeafVerts[2].z;
    local_198._0_4_ = fVar22 - fVar27;
    local_198._4_4_ = fVar35 - fVar27;
    if (fVar43 <= (float)local_198._0_4_) {
      fVar30 = (float)local_198._0_4_;
      fVar31 = fVar43;
      if ((float)local_198._4_4_ <= fVar43) {
        fVar31 = (float)local_198._4_4_;
      }
    }
    else {
      fVar30 = fVar43;
      fVar31 = (float)local_198._0_4_;
      if ((float)local_198._4_4_ <= (float)local_198._0_4_) {
        fVar31 = (float)local_198._4_4_;
      }
    }
    if (fVar28 < fVar31) {
      return;
    }
    fVar31 = (float)local_198._4_4_;
    if ((float)local_198._4_4_ <= fVar30) {
      fVar31 = fVar30;
    }
    if (fVar31 < -fVar28) {
      return;
    }
    _local_188 = ZEXT416((uint)fVar41);
    local_168 = ZEXT416((uint)fVar25);
    fVar31 = (float)local_148._0_4_ - fVar36;
    fVar30 = (float)local_198._4_4_ - fVar43;
    fStack_150 = 0.0 - fVar24;
    fStack_14c = 0.0 - fVar24;
    fVar40 = (float)local_158._0_4_ - fVar34;
    fVar42 = (float)local_158._4_4_ - (float)local_158._0_4_;
    fStack_190 = 0.0 - fVar27;
    fStack_18c = 0.0 - fVar27;
    fStack_140 = 0.0 - fVar37;
    fStack_13c = 0.0 - fVar37;
    fVar24 = fVar43 - (float)local_198._0_4_;
    fVar27 = (float)local_148._4_4_ - (float)local_148._0_4_;
    local_48 = -fVar24;
    fStack_44 = -fVar27;
    fStack_40 = -((0.0 - fVar37) - (float)local_198._4_4_);
    fStack_3c = -((0.0 - fVar37) - (float)local_148._4_4_);
    local_94 = fVar31 * fVar30 - fVar27 * fVar24;
    fVar37 = fVar42 * fVar24 - fVar30 * fVar40;
    fVar39 = fVar40 * fVar27 - fVar42 * fVar31;
    local_90 = CONCAT44(fVar39,fVar37);
    local_108 = ZEXT416((uint)fVar36);
    local_118 = ZEXT416((uint)fVar34);
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      fVar44 = (&(b->mAABB).mExtents.x)[lVar10];
      fVar20 = -fVar44;
      if ((&local_94)[lVar10] <= 0.0) {
        fVar20 = fVar44;
      }
      uVar19 = -(uint)(0.0 < (&local_94)[lVar10]);
      (&local_1a4.x)[lVar10] = fVar20;
      (&vmax.x)[lVar10] = (float)(~uVar19 & (uint)-fVar44 | (uint)fVar44 & uVar19);
    }
    fVar44 = (-local_94 * fVar34 - fVar36 * fVar37) - fVar39 * (float)local_198._0_4_;
    if (0.0 < local_1a4.z * fVar39 + local_1a4.x * local_94 + local_1a4.y * fVar37 + fVar44) {
      return;
    }
    if (fVar44 + vmax.z * fVar39 + local_94 * vmax.x + vmax.y * fVar37 < 0.0) {
      return;
    }
    if (this->mFullPrimBoxTest == true) {
      fVar39 = fVar24 * fVar36 + -fVar31 * (float)local_198._0_4_;
      fVar44 = fVar24 * (float)local_148._4_4_ + -fVar31 * (float)local_198._4_4_;
      fVar37 = fVar44;
      if (fVar39 <= fVar44) {
        fVar37 = fVar39;
      }
      fVar20 = ABS(fVar24) * fVar41 + ABS(fVar31) * fVar28;
      if (fVar20 < fVar37) {
        return;
      }
      if (fVar39 <= fVar44) {
        fVar39 = fVar44;
      }
      if (fVar39 < -fVar20) {
        return;
      }
      fVar39 = fVar40 * (float)local_198._0_4_ + local_48 * fVar34;
      fVar44 = fVar40 * (float)local_198._4_4_ + local_48 * (float)local_158._4_4_;
      fVar37 = fVar44;
      if (fVar39 <= fVar44) {
        fVar37 = fVar39;
      }
      fVar24 = ABS(fVar24) * fVar25 + ABS(fVar40) * fVar28;
      if (fVar24 < fVar37) {
        return;
      }
      if (fVar39 <= fVar44) {
        fVar39 = fVar44;
      }
      if (fVar39 < -fVar24) {
        return;
      }
      fVar37 = fVar31 * (float)local_158._0_4_ + -fVar40 * (float)local_148._0_4_;
      fVar39 = fVar31 * (float)local_158._4_4_ + -fVar40 * (float)local_148._4_4_;
      fVar24 = fVar39;
      if (fVar37 <= fVar39) {
        fVar24 = fVar37;
      }
      fVar31 = ABS(fVar31) * fVar25 + ABS(fVar40) * fVar41;
      if (fVar31 < fVar24) {
        return;
      }
      if (fVar37 <= fVar39) {
        fVar37 = fVar39;
      }
      if (fVar37 < -fVar31) {
        return;
      }
      fVar24 = fVar36 * fVar30 - fVar27 * (float)local_198._0_4_;
      fVar31 = (float)local_148._4_4_ * fVar30 - fVar27 * (float)local_198._4_4_;
      fVar37 = fVar31;
      if (fVar24 <= fVar31) {
        fVar37 = fVar24;
      }
      fVar39 = ABS(fVar30) * fVar41 + ABS(fVar27) * fVar28;
      if (fVar39 < fVar37) {
        return;
      }
      if (fVar24 <= fVar31) {
        fVar24 = fVar31;
      }
      if (fVar24 < -fVar39) {
        return;
      }
      fVar37 = (float)local_198._0_4_ * fVar42 - fVar34 * fVar30;
      fVar31 = (float)local_198._4_4_ * fVar42 - (float)local_158._4_4_ * fVar30;
      fVar24 = fVar31;
      if (fVar37 <= fVar31) {
        fVar24 = fVar37;
      }
      fVar30 = ABS(fVar30) * fVar25 + ABS(fVar42) * fVar28;
      if (fVar30 < fVar24) {
        return;
      }
      if (fVar37 <= fVar31) {
        fVar37 = fVar31;
      }
      if (fVar37 < -fVar30) {
        return;
      }
      fVar37 = fVar27 * fVar34 - fVar36 * fVar42;
      fVar30 = fVar27 * (float)local_158._0_4_ - fVar42 * (float)local_148._0_4_;
      fVar24 = fVar30;
      if (fVar37 <= fVar30) {
        fVar24 = fVar37;
      }
      fVar27 = ABS(fVar27) * fVar25 + ABS(fVar42) * fVar41;
      if (fVar27 < fVar24) {
        return;
      }
      if (fVar37 <= fVar30) {
        fVar37 = fVar30;
      }
      if (fVar37 < -fVar27) {
        return;
      }
      fVar27 = fVar33 - fVar21;
      fVar30 = fVar22 - fVar35;
      fVar37 = fVar36 * fVar30 - (float)local_198._0_4_ * fVar27;
      fVar36 = fVar30 * (float)local_148._0_4_ - fVar43 * fVar27;
      fVar31 = ABS(fVar30) * fVar41 + fVar28 * ABS(fVar27);
      fVar24 = fVar36;
      if (fVar37 <= fVar36) {
        fVar24 = fVar37;
      }
      if (fVar31 < fVar24) {
        return;
      }
      if (fVar37 <= fVar36) {
        fVar37 = fVar36;
      }
      if (fVar37 < -fVar31) {
        return;
      }
      fVar36 = fVar38 - fVar32;
      fVar34 = fVar36 * (float)local_198._0_4_ - fVar34 * fVar30;
      fVar37 = fVar43 * fVar36 - fVar30 * (float)local_158._0_4_;
      fVar24 = fVar37;
      if (fVar34 <= fVar37) {
        fVar24 = fVar34;
      }
      fVar28 = ABS(fVar30) * fVar25 + fVar28 * ABS(fVar36);
      if (fVar28 < fVar24) {
        return;
      }
      if (fVar34 <= fVar37) {
        fVar34 = fVar37;
      }
      if (fVar34 < -fVar28) {
        return;
      }
      fVar24 = fVar27 * (float)local_158._0_4_ - (float)local_148._0_4_ * fVar36;
      fVar37 = fVar27 * (float)local_158._4_4_ - (float)local_148._4_4_ * fVar36;
      fVar34 = fVar37;
      if (fVar24 <= fVar37) {
        fVar34 = fVar24;
      }
      fVar25 = ABS(fVar27) * fVar25 + ABS(fVar36) * fVar41;
      if (fVar25 < fVar34) {
        return;
      }
      if (fVar24 <= fVar37) {
        fVar24 = fVar37;
      }
      if (fVar24 < -fVar25) {
        return;
      }
    }
    b_00 = (AABBNoLeafNode *)b->mPosData;
    if (((ulong)b_00 & 1) == 0) {
      _CollideBoxTri(this,b_00);
    }
    else {
      pMVar7 = this->mIMesh0;
      uVar18 = (udword)((ulong)b_00 >> 1);
      uVar11 = (ulong)(pMVar7->mTriStride * uVar18);
      pIVar8 = pMVar7->mTris;
      pPVar12 = pMVar7->mVerts;
      uVar6 = pMVar7->mVertexStride;
      uVar14 = (ulong)(*(int *)((long)pIVar8->mVRef + uVar11) * uVar6);
      uVar16 = (ulong)(*(int *)((long)pIVar8->mVRef + uVar11 + 4) * uVar6);
      uVar11 = (ulong)(uVar6 * *(int *)((long)pIVar8->mVRef + uVar11 + 8));
      this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
      local_1a4.x = (fVar26 - fVar33) * (fVar35 - fVar22) - (fVar21 - fVar33) * (fVar23 - fVar22);
      fVar24 = *(float *)((long)&pPVar12->z + uVar14);
      fVar25 = *(float *)((long)&pPVar12->z + uVar16);
      fVar34 = *(float *)((long)&pPVar12->x + uVar11);
      fVar39 = (fVar23 - fVar22) * (fVar32 - fVar38) - (fVar35 - fVar22) * (fVar29 - fVar38);
      fVar40 = (fVar29 - fVar38) * (fVar21 - fVar33) - (fVar32 - fVar38) * (fVar26 - fVar33);
      local_1a4.z = fVar40;
      local_1a4.y = fVar39;
      fVar43 = -fVar40 * fVar22 + (-local_1a4.x * fVar38 - fVar33 * fVar39);
      uVar4 = *(undefined8 *)((long)&pPVar12->x + uVar14);
      uVar3 = *(undefined8 *)((long)&pPVar12->x + uVar16);
      fVar27 = (float)uVar3;
      fVar28 = (float)((ulong)uVar3 >> 0x20);
      pfVar1 = (float *)((long)&pPVar12->y + uVar11);
      fVar37 = *pfVar1;
      fVar41 = pfVar1[1];
      fVar42 = (float)uVar4;
      fVar44 = (float)((ulong)uVar4 >> 0x20);
      fVar36 = fVar41 * fVar40 + local_1a4.x * fVar34 + fVar39 * fVar37 + fVar43;
      fVar30 = fVar43 + fVar24 * fVar40 + fVar42 * local_1a4.x + fVar44 * fVar39;
      local_198._4_4_ = fVar43 + fVar25 * fVar40 + fVar27 * local_1a4.x + fVar28 * fVar39;
      fVar31 = fVar43 + fVar40 * 0.0 + fVar44 * local_1a4.x + fVar39 * 0.0;
      fVar43 = fVar43 + fVar40 * 0.0 + fVar28 * local_1a4.x + fVar39 * 0.0;
      fVar30 = (float)(-(uint)(1e-06 <= ABS(fVar30)) & (uint)fVar30);
      local_198._4_4_ = -(uint)(1e-06 <= ABS((float)local_198._4_4_)) & local_198._4_4_;
      fVar36 = (float)(~-(uint)(ABS(fVar36) < 1e-06) & (uint)fVar36);
      local_198._0_4_ = local_198._4_4_;
      fStack_190 = (float)local_198._4_4_;
      fStack_18c = (float)local_198._4_4_;
      local_188._0_4_ = fVar30 * fVar36;
      if ((fVar30 * (float)local_198._4_4_ <= 0.0) || ((float)local_188._0_4_ <= 0.0)) {
        fVar27 = fVar27 - fVar42;
        fVar25 = fVar25 - fVar24;
        fVar34 = fVar34 - fVar42;
        fVar37 = fVar37 - fVar44;
        fVar41 = fVar41 - fVar24;
        fVar20 = fVar25 * fVar34 - fVar41 * fVar27;
        fVar34 = fVar27 * fVar37 - fVar34 * (fVar28 - fVar44);
        fVar37 = (fVar28 - fVar44) * fVar41 - fVar37 * fVar25;
        local_188._4_4_ = local_198._4_4_;
        uStack_180 = -(uint)(0.0 <= ABS(fVar31)) & (uint)fVar31;
        uStack_17c = -(uint)(0.0 <= ABS(fVar43)) & (uint)fVar43;
        fVar24 = fVar24 * -fVar34 + -fVar37 * fVar42 + -fVar20 * fVar44;
        fVar25 = fVar35 * fVar34 + fVar32 * fVar37 + fVar20 * fVar21 + fVar24;
        fVar29 = fVar23 * fVar34 + fVar29 * fVar37 + fVar20 * fVar26 + fVar24;
        fVar24 = fVar22 * fVar34 + fVar38 * fVar37 + fVar20 * fVar33 + fVar24;
        fVar29 = (float)(-(uint)(1e-06 <= ABS(fVar29)) & (uint)fVar29);
        fVar24 = (float)(-(uint)(1e-06 <= ABS(fVar24)) & (uint)fVar24);
        fVar25 = (float)(~-(uint)(ABS(fVar25) < 1e-06) & (uint)fVar25);
        if ((fVar24 * fVar29 <= 0.0) || (fVar24 * fVar25 <= 0.0)) {
          pPVar15 = (Point *)((long)&pPVar12->x + uVar14);
          pPVar17 = (Point *)((long)&pPVar12->x + uVar16);
          pPVar12 = (Point *)((long)&pPVar12->x + uVar11);
          fVar32 = ABS(fVar34 * fVar39 + fVar20 * -fVar40);
          fVar34 = ABS(fVar37 * fVar40 + fVar34 * -local_1a4.x);
          fVar38 = fVar34;
          if (fVar34 <= fVar32) {
            fVar38 = fVar32;
          }
          uVar19 = (uint)(fVar32 < fVar34);
          if (fVar38 < ABS(local_1a4.x * fVar20 + fVar37 * -fVar39)) {
            uVar19 = 2;
          }
          uVar11 = (ulong)(uVar19 << 2);
          fVar38 = *(float *)((long)&v0->x + uVar11);
          fVar32 = *(float *)((long)&v1->x + uVar11);
          fVar34 = *(float *)((long)&v2->x + uVar11);
          fVar33 = *(float *)((long)&pPVar15->x + uVar11);
          fVar26 = *(float *)((long)&pPVar17->x + uVar11);
          fVar37 = *(float *)((long)&pPVar12->x + uVar11);
          if (0.0 < fVar24 * fVar29) {
            fVar21 = (fVar38 - fVar34) * fVar25;
            fVar22 = (fVar32 - fVar34) * fVar25;
            fVar41 = fVar25 - fVar29;
            fVar25 = fVar25 - fVar24;
            fVar38 = fVar34;
LAB_0019ffed:
            if (fVar30 * (float)local_198._4_4_ <= 0.0) {
              if ((float)local_188._0_4_ <= 0.0) {
                if ((fVar30 != 0.0) || (0.0 < (float)local_198._4_4_ * fVar36)) {
                  fVar24 = (fVar37 - fVar33) * fVar30;
                  fVar32 = (fVar26 - fVar33) * fVar30;
                  fVar29 = fVar30 - (float)local_198._4_4_;
                  fVar36 = fVar30 - fVar36;
                  goto LAB_001a0099;
                }
                if (((float)local_198._4_4_ == 0.0) && (!NAN((float)local_198._4_4_))) {
                  if ((fVar36 == 0.0) && (!NAN(fVar36))) goto LAB_001a01c5;
                  goto LAB_0019fff8;
                }
              }
              fVar24 = (fVar37 - fVar26) * (float)local_198._4_4_;
              fVar32 = (fVar33 - fVar26) * (float)local_198._4_4_;
              fVar29 = (float)local_198._4_4_ - fVar30;
              fVar36 = (float)local_198._4_4_ - fVar36;
              fVar33 = fVar26;
            }
            else {
LAB_0019fff8:
              fVar24 = (fVar26 - fVar37) * fVar36;
              fVar32 = (fVar33 - fVar37) * fVar36;
              fVar29 = fVar36 - fVar30;
              fVar36 = fVar36 - (float)local_198._4_4_;
              fVar33 = fVar37;
            }
LAB_001a0099:
            fVar26 = fVar25 * fVar41;
            fVar37 = fVar36 * fVar29;
            fVar38 = fVar38 * fVar26 * fVar37;
            fVar34 = fVar38 + fVar37 * fVar21 * fVar41;
            fVar38 = fVar38 + fVar37 * fVar22 * fVar25;
            fVar33 = fVar26 * fVar37 * fVar33;
            fVar24 = fVar26 * fVar24 * fVar29 + fVar33;
            fVar33 = fVar26 * fVar32 * fVar36 + fVar33;
            fVar29 = fVar34;
            if (fVar34 <= fVar38) {
              fVar29 = fVar38;
            }
            fVar25 = fVar24;
            if (fVar33 <= fVar24) {
              fVar25 = fVar33;
            }
            if (fVar25 <= fVar29) {
              if (fVar34 <= fVar38) {
                fVar38 = fVar34;
              }
              if (fVar33 <= fVar24) {
                fVar33 = fVar24;
              }
              if (fVar38 <= fVar33) goto LAB_001a0119;
            }
          }
          else {
            if (0.0 < fVar24 * fVar25) {
LAB_0019ffa5:
              fVar21 = (fVar38 - fVar32) * fVar29;
              fVar22 = (fVar34 - fVar32) * fVar29;
              fVar41 = fVar29 - fVar25;
              fVar25 = fVar29 - fVar24;
              fVar38 = fVar32;
              goto LAB_0019ffed;
            }
            if (((fVar24 != 0.0) || (NAN(fVar24))) || (0.0 < fVar29 * fVar25)) {
              fVar21 = (fVar32 - fVar38) * fVar24;
              fVar22 = (fVar34 - fVar38) * fVar24;
              fVar41 = fVar24 - fVar25;
              fVar25 = fVar24 - fVar29;
              goto LAB_0019ffed;
            }
            if ((fVar29 != 0.0) || (NAN(fVar29))) goto LAB_0019ffa5;
            if ((fVar25 != 0.0) || (NAN(fVar25))) {
              fVar21 = (fVar38 - fVar34) * fVar25;
              fVar22 = (fVar32 - fVar34) * fVar25;
              fVar41 = fVar25 - fVar29;
              fVar25 = fVar25 - fVar24;
              fVar38 = fVar34;
              goto LAB_0019ffed;
            }
LAB_001a01c5:
            BVar9 = CoplanarTriTri(&local_1a4,v0,v1,v2,pPVar15,pPVar17,pPVar12);
            if (BVar9 != 0) {
LAB_001a0119:
              uVar19 = (this->mPairs).mCurNbEntries;
              if (uVar19 == (this->mPairs).mMaxNbEntries) {
                IceCore::Container::Resize(local_170,1);
                uVar19 = (this->mPairs).mCurNbEntries;
              }
              puVar13 = (this->mPairs).mEntries;
              (this->mPairs).mCurNbEntries = uVar19 + 1;
              puVar13[uVar19] = uVar18;
              uVar19 = (this->mPairs).mCurNbEntries;
              uVar6 = this->mLeafIndex;
              if (uVar19 == (this->mPairs).mMaxNbEntries) {
                IceCore::Container::Resize(local_170,1);
                puVar13 = (this->mPairs).mEntries;
                uVar19 = (this->mPairs).mCurNbEntries;
              }
              (this->mPairs).mCurNbEntries = uVar19 + 1;
              puVar13[uVar19] = uVar6;
              puVar13 = &(this->super_Collider).mFlags;
              *(byte *)puVar13 = (byte)*puVar13 | 4;
            }
          }
        }
      }
    }
    if ((~(this->super_Collider).mFlags & 5) == 0) {
      return;
    }
    b = (AABBNoLeafNode *)b->mNegData;
  } while (((ulong)b & 1) == 0);
  pMVar7 = this->mIMesh0;
  uVar18 = (udword)((ulong)b >> 1);
  uVar11 = (ulong)(pMVar7->mTriStride * uVar18);
  pIVar8 = pMVar7->mTris;
  uVar6 = pMVar7->mVertexStride;
  uVar14 = (ulong)(*(int *)((long)pIVar8->mVRef + uVar11) * uVar6);
  uVar16 = (ulong)(*(int *)((long)pIVar8->mVRef + uVar11 + 4) * uVar6);
  uVar11 = (ulong)(uVar6 * *(int *)((long)pIVar8->mVRef + uVar11 + 8));
  pPVar15 = pMVar7->mVerts;
  this->mNbPrimPrimTests = this->mNbPrimPrimTests + 1;
  fVar38 = this->mLeafVerts[1].x;
  fVar29 = this->mLeafVerts[0].x;
  fVar24 = this->mLeafVerts[1].y;
  fVar25 = this->mLeafVerts[1].z;
  pPVar12 = this->mLeafVerts + 2;
  fVar32 = this->mLeafVerts[2].y;
  fVar34 = this->mLeafVerts[2].z;
  fVar33 = *(float *)((long)&pPVar15->z + uVar14);
  _local_198 = ZEXT416((uint)fVar33);
  uVar2 = this->mLeafVerts[0].y;
  uVar5 = this->mLeafVerts[0].z;
  local_f8 = ZEXT416((uint)fVar24);
  local_168 = ZEXT416((uint)fVar38);
  fVar37 = pPVar12->x - fVar29;
  local_118 = ZEXT416((uint)fVar32);
  _local_148 = ZEXT416((uint)fVar25);
  fVar41 = fVar34 - (float)uVar5;
  local_1a4.x = (fVar24 - (float)uVar2) * fVar41 - (fVar25 - (float)uVar5) * (fVar32 - (float)uVar2)
  ;
  fVar26 = *(float *)((long)&pPVar15->z + uVar16);
  fVar23 = (fVar25 - (float)uVar5) * fVar37 - fVar41 * (fVar38 - fVar29);
  fVar27 = (fVar32 - (float)uVar2) * (fVar38 - fVar29) - fVar37 * (fVar24 - (float)uVar2);
  _local_158 = ZEXT416((uint)fVar29);
  fVar37 = *(float *)((long)&pPVar15->x + uVar11);
  local_1a4.z = fVar27;
  local_1a4.y = fVar23;
  fVar41 = (float)uVar5 * -fVar27 + (-local_1a4.x * fVar29 - (float)uVar2 * fVar23);
  uVar4 = *(undefined8 *)((long)&pPVar15->y + uVar11);
  fVar43 = (float)uVar4;
  fVar30 = (float)((ulong)uVar4 >> 0x20);
  uVar4 = *(undefined8 *)((long)&pPVar15->x + uVar14);
  fVar28 = (float)uVar4;
  fVar35 = (float)((ulong)uVar4 >> 0x20);
  uVar4 = *(undefined8 *)((long)&pPVar15->x + uVar16);
  fVar31 = (float)uVar4;
  fVar39 = (float)((ulong)uVar4 >> 0x20);
  fVar36 = fVar30 * fVar27 + local_1a4.x * fVar37 + fVar23 * fVar43 + fVar41;
  fVar21 = fVar41 + fVar33 * fVar27 + fVar28 * local_1a4.x + fVar35 * fVar23;
  local_138._4_4_ = fVar41 + fVar26 * fVar27 + fVar31 * local_1a4.x + fVar39 * fVar23;
  fVar22 = fVar41 + fVar27 * 0.0 + fVar35 * local_1a4.x + fVar23 * 0.0;
  fVar41 = fVar41 + fVar27 * 0.0 + fVar39 * local_1a4.x + fVar23 * 0.0;
  fVar21 = (float)(-(uint)(1e-06 <= ABS(fVar21)) & (uint)fVar21);
  local_138._4_4_ = -(uint)(1e-06 <= ABS((float)local_138._4_4_)) & local_138._4_4_;
  uStack_180 = -(uint)(0.0 <= ABS(fVar22)) & (uint)fVar22;
  uStack_17c = -(uint)(0.0 <= ABS(fVar41)) & (uint)fVar41;
  fVar36 = (float)(~-(uint)(ABS(fVar36) < 1e-06) & (uint)fVar36);
  local_138._0_4_ = local_138._4_4_;
  fStack_130 = (float)local_138._4_4_;
  fStack_12c = (float)local_138._4_4_;
  local_128._0_4_ = fVar21 * (float)local_138._4_4_;
  local_188._0_4_ = fVar21 * fVar36;
  local_188._4_4_ = local_138._4_4_;
  local_128._4_4_ = local_138._4_4_;
  uStack_120 = uStack_180;
  uStack_11c = uStack_17c;
  if ((0.0 < (float)local_128._0_4_) && (0.0 < (float)local_188._0_4_)) {
    return;
  }
  fVar31 = fVar31 - fVar28;
  fVar26 = fVar26 - fVar33;
  fVar37 = fVar37 - fVar28;
  fVar43 = fVar43 - fVar35;
  fVar30 = fVar30 - fVar33;
  fVar41 = fVar26 * fVar37 - fVar30 * fVar31;
  fVar37 = fVar31 * fVar43 - fVar37 * (fVar39 - fVar35);
  fVar26 = (fVar39 - fVar35) * fVar30 - fVar43 * fVar26;
  local_108._0_4_ = (*pPVar12).x;
  fVar33 = fVar33 * -fVar37 + -fVar26 * fVar28 + -fVar41 * fVar35;
  fVar32 = fVar34 * fVar37 + (float)local_108._0_4_ * fVar26 + fVar41 * fVar32 + fVar33;
  fVar38 = fVar25 * fVar37 + fVar38 * fVar26 + fVar41 * fVar24 + fVar33;
  fVar33 = (float)uVar5 * fVar37 + fVar29 * fVar26 + fVar41 * (float)uVar2 + fVar33;
  fVar38 = (float)(-(uint)(1e-06 <= ABS(fVar38)) & (uint)fVar38);
  fVar33 = (float)(-(uint)(1e-06 <= ABS(fVar33)) & (uint)fVar33);
  fVar32 = (float)(~-(uint)(ABS(fVar32) < 1e-06) & (uint)fVar32);
  if ((0.0 < fVar33 * fVar38) && (0.0 < fVar33 * fVar32)) {
    return;
  }
  pPVar17 = (Point *)((long)&pPVar15->x + uVar14);
  u1 = (Point *)((long)&pPVar15->x + uVar16);
  pPVar15 = (Point *)((long)&pPVar15->x + uVar11);
  fVar24 = ABS(fVar37 * fVar23 + fVar41 * -fVar27);
  fVar25 = ABS(fVar26 * fVar27 + fVar37 * -local_1a4.x);
  fVar29 = fVar25;
  if (fVar25 <= fVar24) {
    fVar29 = fVar24;
  }
  uVar19 = (uint)(fVar24 < fVar25);
  if (fVar29 < ABS(local_1a4.x * fVar41 + fVar26 * -fVar23)) {
    uVar19 = 2;
  }
  uVar11 = (ulong)(uVar19 << 2);
  fVar29 = *(float *)((long)&v0->x + uVar11);
  fVar24 = *(float *)((long)&v1->x + uVar11);
  fVar25 = *(float *)((long)&v2->x + uVar11);
  fVar34 = *(float *)((long)&pPVar17->x + uVar11);
  fVar26 = *(float *)((long)&u1->x + uVar11);
  fVar37 = *(float *)((long)&pPVar15->x + uVar11);
  local_108 = *(undefined1 (*) [16])pPVar12;
  if (fVar33 * fVar38 <= 0.0) {
    if (0.0 < fVar33 * fVar32) {
LAB_001a06b3:
      fVar22 = (fVar29 - fVar24) * fVar38;
      fVar23 = (fVar25 - fVar24) * fVar38;
      fVar41 = fVar38 - fVar32;
      fVar32 = fVar38 - fVar33;
      fVar29 = fVar24;
      goto LAB_001a0707;
    }
    if (((fVar33 != 0.0) || (NAN(fVar33))) || (0.0 < fVar38 * fVar32)) {
      fVar22 = (fVar24 - fVar29) * fVar33;
      fVar23 = (fVar25 - fVar29) * fVar33;
      fVar41 = fVar33 - fVar32;
      fVar32 = fVar33 - fVar38;
      goto LAB_001a0707;
    }
    if ((fVar38 != 0.0) || (NAN(fVar38))) goto LAB_001a06b3;
    if ((fVar32 != 0.0) || (NAN(fVar32))) goto LAB_001a0662;
LAB_001a08c2:
    BVar9 = CoplanarTriTri(&local_1a4,v0,v1,v2,pPVar17,u1,pPVar15);
    if (BVar9 == 0) {
      return;
    }
    goto LAB_001a0836;
  }
LAB_001a0662:
  fVar22 = (fVar29 - fVar25) * fVar32;
  fVar23 = (fVar24 - fVar25) * fVar32;
  fVar41 = fVar32 - fVar38;
  fVar32 = fVar32 - fVar33;
  fVar29 = fVar25;
LAB_001a0707:
  if ((float)local_128._0_4_ <= 0.0) {
    if ((float)local_188._0_4_ <= 0.0) {
      if (((fVar21 != 0.0) || (NAN(fVar21))) || (0.0 < (float)local_138._4_4_ * fVar36)) {
        fVar24 = (fVar37 - fVar34) * fVar21;
        fVar25 = (fVar26 - fVar34) * fVar21;
        fVar38 = fVar21 - (float)local_138._4_4_;
        fVar36 = fVar21 - fVar36;
        goto LAB_001a07c2;
      }
      if (((float)local_138._4_4_ == 0.0) && (!NAN((float)local_138._4_4_))) {
        if ((fVar36 == 0.0) && (!NAN(fVar36))) goto LAB_001a08c2;
        goto LAB_001a0717;
      }
    }
    fVar24 = (fVar37 - fVar26) * (float)local_138._4_4_;
    fVar25 = (fVar34 - fVar26) * (float)local_138._4_4_;
    fVar38 = (float)local_138._4_4_ - fVar21;
    fVar36 = (float)local_138._4_4_ - fVar36;
    fVar34 = fVar26;
  }
  else {
LAB_001a0717:
    fVar24 = (fVar26 - fVar37) * fVar36;
    fVar25 = (fVar34 - fVar37) * fVar36;
    fVar38 = fVar36 - fVar21;
    fVar36 = fVar36 - (float)local_138._4_4_;
    fVar34 = fVar37;
  }
LAB_001a07c2:
  fVar33 = fVar32 * fVar41;
  fVar26 = fVar36 * fVar38;
  fVar29 = fVar29 * fVar33 * fVar26;
  fVar37 = fVar29 + fVar26 * fVar22 * fVar41;
  fVar29 = fVar29 + fVar26 * fVar23 * fVar32;
  fVar34 = fVar33 * fVar26 * fVar34;
  fVar24 = fVar33 * fVar24 * fVar38 + fVar34;
  fVar34 = fVar33 * fVar25 * fVar36 + fVar34;
  fVar38 = fVar37;
  if (fVar37 <= fVar29) {
    fVar38 = fVar29;
  }
  fVar25 = fVar24;
  if (fVar34 <= fVar24) {
    fVar25 = fVar34;
  }
  if (fVar38 < fVar25) {
    return;
  }
  if (fVar37 <= fVar29) {
    fVar29 = fVar37;
  }
  if (fVar34 <= fVar24) {
    fVar34 = fVar24;
  }
  if (fVar34 < fVar29) {
    return;
  }
LAB_001a0836:
  uVar19 = (this->mPairs).mCurNbEntries;
  if (uVar19 == (this->mPairs).mMaxNbEntries) {
    IceCore::Container::Resize(local_170,1);
    uVar19 = (this->mPairs).mCurNbEntries;
  }
  puVar13 = (this->mPairs).mEntries;
  (this->mPairs).mCurNbEntries = uVar19 + 1;
  puVar13[uVar19] = uVar18;
  uVar19 = (this->mPairs).mCurNbEntries;
  uVar6 = this->mLeafIndex;
  if (uVar19 == (this->mPairs).mMaxNbEntries) {
    IceCore::Container::Resize(local_170,1);
    puVar13 = (this->mPairs).mEntries;
    uVar19 = (this->mPairs).mCurNbEntries;
  }
  (this->mPairs).mCurNbEntries = uVar19 + 1;
  puVar13[uVar19] = uVar6;
  puVar13 = &(this->super_Collider).mFlags;
  *(byte *)puVar13 = (byte)*puVar13 | 4;
  return;
}

Assistant:

void AABBTreeCollider::_CollideBoxTri(const AABBNoLeafNode* b)
{
	// Perform triangle-box overlap test
	if(!TriBoxOverlap(b->mAABB.mCenter, b->mAABB.mExtents))	return;

	// Keep same triangle, deal with first child
	if(b->HasPosLeaf())	PrimTestIndexTri(b->GetPosPrimitive());
	else				_CollideBoxTri(b->GetPos());

	if(ContactFound()) return;

	// Keep same triangle, deal with second child
	if(b->HasNegLeaf())	PrimTestIndexTri(b->GetNegPrimitive());
	else				_CollideBoxTri(b->GetNeg());
}